

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O3

void __thiscall Shell::EqualityProxyMono::addAxioms(EqualityProxyMono *this,UnitList **units)

{
  uint uVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  uint uVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  
  uVar1 = s_proxyPredicates._timestamp;
  pEVar6 = s_proxyPredicates._entries;
  pEVar3 = s_proxyPredicates._afterLast;
  if (this->_opt == RSTC) {
    addCongruenceAxioms(this,units);
    uVar1 = s_proxyPredicates._timestamp;
    pEVar6 = s_proxyPredicates._entries;
    pEVar3 = s_proxyPredicates._afterLast;
  }
  while (pEVar2 = pEVar6, pEVar5 = s_proxyPredicates._afterLast,
        uVar4 = s_proxyPredicates._timestamp, pEVar2 != s_proxyPredicates._afterLast) {
    pEVar6 = pEVar2 + 1;
    s_proxyPredicates._afterLast = pEVar5;
    s_proxyPredicates._timestamp = uVar4;
    if (((pEVar2->field_0)._infoData & 1U) == 0 &&
        (uint)(pEVar2->field_0)._infoData >> 2 == s_proxyPredicates._timestamp) {
      s_proxyPredicates._timestamp = uVar1;
      s_proxyPredicates._afterLast = pEVar3;
      addLocalAxioms(this,units,(TermList)(pEVar2->_key)._content);
      uVar1 = s_proxyPredicates._timestamp;
      pEVar3 = s_proxyPredicates._afterLast;
      s_proxyPredicates._afterLast = pEVar5;
      s_proxyPredicates._timestamp = uVar4;
    }
  }
  s_proxyPredicates._timestamp = uVar1;
  s_proxyPredicates._afterLast = pEVar3;
  return;
}

Assistant:

void EqualityProxyMono::addAxioms(UnitList*& units)
{
  // if we're adding congruence axioms, we need to add them before adding the local axioms.
  // Local axioms are added only for sorts on which equality is used, and the congruence axioms
  // may spread the equality use into new sorts
  if (_opt == Options::EqualityProxy::RSTC) {
    addCongruenceAxioms(units);
  }

  DHMap<TermList, unsigned>::Iterator it(s_proxyPredicates);
  while(it.hasNext()) {
    addLocalAxioms(units, it.nextKey());
  }
}